

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loopsubdiv.cpp
# Opt level: O0

SDVertex * __thiscall pbrt::SDFace::otherVert(SDFace *this,SDVertex *v0,SDVertex *v1)

{
  long in_RDX;
  long in_RSI;
  long in_RDI;
  int i;
  char *in_stack_00000088;
  int in_stack_00000094;
  char *in_stack_00000098;
  LogLevel in_stack_000000a4;
  undefined4 local_1c;
  
  local_1c = 0;
  while( true ) {
    if (2 < local_1c) {
      LogFatal(in_stack_000000a4,in_stack_00000098,in_stack_00000094,in_stack_00000088);
    }
    if ((*(long *)(in_RDI + (long)local_1c * 8) != in_RSI) &&
       (*(long *)(in_RDI + (long)local_1c * 8) != in_RDX)) break;
    local_1c = local_1c + 1;
  }
  return *(SDVertex **)(in_RDI + (long)local_1c * 8);
}

Assistant:

SDVertex *otherVert(SDVertex *v0, SDVertex *v1) {
        for (int i = 0; i < 3; ++i)
            if (v[i] != v0 && v[i] != v1)
                return v[i];
        LOG_FATAL("Basic logic error in SDFace::otherVert()");
        return nullptr;
    }